

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O3

void __thiscall FNodeBuilder::GroupSegPlanes(FNodeBuilder *this)

{
  uint *puVar1;
  FSimpleVert FVar2;
  FPrivSeg *pFVar3;
  FPrivVert *pFVar4;
  FSimpleVert FVar5;
  FPrivSeg *pFVar6;
  FSimpleLine *pFVar7;
  uint uVar8;
  int iVar9;
  FPrivSeg *pFVar10;
  long lVar11;
  uint amount;
  int iVar12;
  int iVar13;
  int iVar15;
  int iVar16;
  double dVar14;
  int iVar17;
  int iVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  FPrivSeg *buckets [4096];
  long local_8038 [4097];
  
  amount = 0;
  memset(local_8038,0,0x8000);
  uVar8 = (this->Segs).Count;
  pFVar3 = (this->Segs).Array;
  if ((long)(int)uVar8 < 1) {
    pFVar3[uVar8 - 1].next = 0xffffffff;
  }
  else {
    iVar9 = 1;
    lVar11 = 0;
    do {
      *(int *)((long)&pFVar3->next + lVar11) = iVar9;
      *(undefined8 *)((long)&pFVar3->hashnext + lVar11) = 0;
      lVar11 = lVar11 + 0x48;
      iVar9 = iVar9 + 1;
    } while ((long)(int)uVar8 * 0x48 != lVar11);
    pFVar3[uVar8 - 1].next = 0xffffffff;
    if ((int)uVar8 < 1) {
      amount = 0;
    }
    else {
      lVar11 = 0;
      iVar9 = 0;
      do {
        pFVar4 = (this->Vertices).Array;
        pFVar3 = (this->Segs).Array + lVar11;
        FVar5 = pFVar4[pFVar3->v1].super_FSimpleVert;
        iVar12 = FVar5.x;
        iVar15 = FVar5.y;
        FVar5 = pFVar4[pFVar3->v2].super_FSimpleVert;
        iVar13 = FVar5.x;
        iVar16 = FVar5.y;
        dVar14 = c_atan2((double)(iVar16 - iVar15),(double)(iVar13 - iVar12));
        uVar8 = (uint)(int)(dVar14 * 341782637.7882158) >> 0x12 & 0xfff;
        pFVar6 = (FPrivSeg *)local_8038[uVar8];
        pFVar4 = (this->Vertices).Array;
        if (pFVar6 != (FPrivSeg *)0x0) {
          pFVar10 = pFVar6;
          do {
            iVar17 = pFVar4[pFVar10->v1].super_FSimpleVert.x;
            iVar18 = pFVar4[pFVar10->v1].super_FSimpleVert.y;
            dVar20 = (double)(pFVar4[pFVar10->v2].super_FSimpleVert.x - iVar17);
            dVar21 = (double)(pFVar4[pFVar10->v2].super_FSimpleVert.y - iVar18);
            dVar14 = (double)iVar17;
            dVar19 = (double)iVar18;
            dVar23 = (dVar19 - (double)iVar15) * dVar20 - (dVar14 - (double)iVar12) * dVar21;
            if ((((ABS(dVar23) < 17179869184.0) &&
                 (dVar22 = dVar21 * dVar21 + dVar20 * dVar20,
                 (dVar23 * dVar23) / dVar22 < 42.94967296)) &&
                (dVar14 = (dVar19 - (double)iVar16) * dVar20 - (dVar14 - (double)iVar13) * dVar21,
                ABS(dVar14) < 17179869184.0)) && ((dVar14 * dVar14) / dVar22 < 42.94967296)) {
              iVar17 = pFVar10->planenum;
              pFVar3->planenum = iVar17;
              pFVar7 = (this->Planes).Array;
              iVar18 = pFVar7[iVar17].dx;
              if (iVar18 == 0) {
                iVar18 = pFVar7[iVar17].dy;
                if ((iVar16 <= iVar15) || (iVar18 < 1)) {
                  if (iVar16 < iVar15) goto LAB_004fbae1;
                  goto LAB_004fbaec;
                }
              }
              else if ((iVar13 <= iVar12) || (iVar18 < 1)) {
                if (iVar13 < iVar12) {
LAB_004fbae1:
                  if (iVar18 < 0) goto LAB_004fbae5;
                }
LAB_004fbaec:
                pFVar3->planefront = false;
                goto LAB_004fba8b;
              }
LAB_004fbae5:
              pFVar3->planefront = true;
              goto LAB_004fba8b;
            }
            pFVar10 = pFVar10->hashnext;
          } while (pFVar10 != (FPrivSeg *)0x0);
        }
        pFVar3->hashnext = pFVar6;
        local_8038[uVar8] = (long)pFVar3;
        pFVar3->planenum = iVar9;
        iVar9 = iVar9 + 1;
        pFVar3->planefront = true;
        FVar5 = pFVar4[pFVar3->v1].super_FSimpleVert;
        FVar2 = pFVar4[pFVar3->v2].super_FSimpleVert;
        TArray<FNodeBuilder::FSimpleLine,_FNodeBuilder::FSimpleLine>::Grow(&this->Planes,1);
        pFVar7 = (this->Planes).Array + (this->Planes).Count;
        pFVar7->x = FVar5.x;
        pFVar7->y = FVar5.y;
        pFVar7->dx = FVar2.x - FVar5.x;
        pFVar7->dy = FVar2.y - FVar5.y;
        puVar1 = &(this->Planes).Count;
        *puVar1 = *puVar1 + 1;
LAB_004fba8b:
        lVar11 = lVar11 + 1;
      } while (lVar11 < (int)(this->Segs).Count);
      iVar12 = iVar9 + 0xe;
      if (-1 < iVar9 + 7) {
        iVar12 = iVar9 + 7;
      }
      amount = iVar12 >> 3;
    }
  }
  TArray<unsigned_char,_unsigned_char>::Grow(&this->PlaneChecked,amount);
  puVar1 = &(this->PlaneChecked).Count;
  *puVar1 = *puVar1 + amount;
  return;
}

Assistant:

void FNodeBuilder::GroupSegPlanes ()
{
	const int bucketbits = 12;
	FPrivSeg *buckets[1<<bucketbits] = { 0 };
	int i, planenum;

	for (i = 0; i < (int)Segs.Size(); ++i)
	{
		FPrivSeg *seg = &Segs[i];
		seg->next = i+1;
		seg->hashnext = NULL;
	}

	Segs[Segs.Size()-1].next = DWORD_MAX;

	for (i = planenum = 0; i < (int)Segs.Size(); ++i)
	{
		FPrivSeg *seg = &Segs[i];
		fixed_t x1 = Vertices[seg->v1].x;
		fixed_t y1 = Vertices[seg->v1].y;
		fixed_t x2 = Vertices[seg->v2].x;
		fixed_t y2 = Vertices[seg->v2].y;
		angle_t ang = PointToAngle (x2 - x1, y2 - y1);

		if (ang >= 1u<<31)
			ang += 1u<<31;

		FPrivSeg *check = buckets[ang >>= 31-bucketbits];

		while (check != NULL)
		{
			fixed_t cx1 = Vertices[check->v1].x;
			fixed_t cy1 = Vertices[check->v1].y;
			fixed_t cdx = Vertices[check->v2].x - cx1;
			fixed_t cdy = Vertices[check->v2].y - cy1;
			if (PointOnSide (x1, y1, cx1, cy1, cdx, cdy) == 0 &&
				PointOnSide (x2, y2, cx1, cy1, cdx, cdy) == 0)
			{
				break;
			}
			check = check->hashnext;
		}
		if (check != NULL)
		{
			seg->planenum = check->planenum;
			const FSimpleLine *line = &Planes[seg->planenum];
			if (line->dx != 0)
			{
				if ((line->dx > 0 && x2 > x1) || (line->dx < 0 && x2 < x1))
				{
					seg->planefront = true;
				}
				else
				{
					seg->planefront = false;
				}
			}
			else
			{
				if ((line->dy > 0 && y2 > y1) || (line->dy < 0 && y2 < y1))
				{
					seg->planefront = true;
				}
				else
				{
					seg->planefront = false;
				}
			}
		}
		else
		{
			seg->hashnext = buckets[ang];
			buckets[ang] = seg;
			seg->planenum = planenum++;
			seg->planefront = true;

			FSimpleLine pline = { Vertices[seg->v1].x,
								  Vertices[seg->v1].y,
								  Vertices[seg->v2].x - Vertices[seg->v1].x,
								  Vertices[seg->v2].y - Vertices[seg->v1].y };
			Planes.Push (pline);
		}
	}

	D(Printf ("%d planes from %d segs\n", planenum, Segs.Size()));

	PlaneChecked.Reserve ((planenum + 7) / 8);
}